

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::reverse(SVInt *this)

{
  byte bVar1;
  bitwidth_t bits;
  uint uVar2;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar3;
  ulong uVar4;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  ulong *in_RSI;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  SVInt SVar12;
  SVInt result;
  unsigned_long *__old_val;
  
  bits = (bitwidth_t)in_RSI[1];
  if (bits < 0x41 && (*(byte *)((long)in_RSI + 0xd) & 1) == 0) {
    uVar4 = *in_RSI;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    uVar4 = (uVar4 & 0xf0f0f0f0f0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f0f0f0f0f;
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333) * 4;
    SVInt(this,bits,
          (uVar4 >> 1 & 0x5555555555555555) + (uVar4 & 0x5555555555555555) * 2 >>
          (-(char)bits & 0x3fU),*(bool *)((long)in_RSI + 0xc));
    uVar6 = extraout_RDX;
  }
  else {
    allocUninitialized(&result,bits,*(bool *)((long)in_RSI + 0xc),
                       (bool)(*(byte *)((long)in_RSI + 0xd) & 1));
    aVar3 = result.super_SVIntStorage.field_0;
    uVar2 = (uint)in_RSI[1];
    uVar9 = uVar2 + 0x3f >> 6;
    uVar4 = (ulong)uVar9;
    aVar5.pVal = (uint64_t *)&result;
    if (0x40 < result.super_SVIntStorage.bitWidth ||
        (result.super_SVIntStorage.unknownFlag & 1U) != 0) {
      aVar5 = result.super_SVIntStorage.field_0;
    }
    bVar1 = *(byte *)((long)in_RSI + 0xd);
    puVar11 = in_RSI;
    if ((bVar1 & 1) != 0) {
      puVar11 = (ulong *)*in_RSI;
    }
    if (0x40 < uVar2) {
      puVar11 = (ulong *)*in_RSI;
    }
    uVar10 = uVar9;
    for (uVar7 = 0; uVar10 = uVar10 - 1, uVar9 * 8 != uVar7; uVar7 = uVar7 + 8) {
      uVar8 = puVar11[uVar10];
      uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      uVar8 = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar8 >> 4 & 0xf0f0f0f0f0f0f0f;
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333) * 4;
      *(ulong *)((long)aVar5.pVal + uVar7) =
           (uVar8 >> 1 & 0x5555555555555555) + (uVar8 & 0x5555555555555555) * 2;
    }
    if ((bVar1 & 1) != 0) {
      uVar10 = uVar9 * 8;
      uVar7 = 0;
      while( true ) {
        uVar9 = uVar9 - 1;
        if (uVar7 == uVar4) break;
        uVar8 = *(ulong *)((long)puVar11 + (ulong)uVar9 * 8 + (ulong)uVar10);
        uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
                uVar8 << 0x38;
        uVar8 = (uVar8 & 0xf0f0f0f0f0f0f0f) << 4 | uVar8 >> 4 & 0xf0f0f0f0f0f0f0f;
        uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333) * 4;
        *(ulong *)((long)aVar5.pVal + uVar7 * 8 + (ulong)uVar10) =
             (uVar8 >> 1 & 0x5555555555555555) + (uVar8 & 0x5555555555555555) * 2;
        uVar7 = uVar7 + 1;
      }
    }
    if ((uVar2 & 0x3f) == 0) {
      (this->super_SVIntStorage).bitWidth = result.super_SVIntStorage.bitWidth;
      (this->super_SVIntStorage).signFlag = result.super_SVIntStorage.signFlag;
      (this->super_SVIntStorage).unknownFlag = result.super_SVIntStorage.unknownFlag;
      aVar5 = result.super_SVIntStorage.field_0;
      if (0x40 < result.super_SVIntStorage.bitWidth ||
          (result.super_SVIntStorage.unknownFlag & 1U) != 0) {
        result.super_SVIntStorage.field_0.val = 0;
        aVar5 = aVar3;
      }
      (this->super_SVIntStorage).field_0 = aVar5;
    }
    else {
      lshr(this,(bitwidth_t)&result);
    }
    ~SVInt(&result);
    uVar6 = extraout_RDX_00;
  }
  SVar12.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar12.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar12.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar12.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar12.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar12.super_SVIntStorage;
}

Assistant:

SVInt SVInt::reverse() const {
    if (isSingleWord()) {
        uint64_t r = reverseBits64(val) >> (BITS_PER_WORD - bitWidth);
        return SVInt(bitWidth, r, signFlag);
    }

    auto result = SVInt::allocUninitialized(bitWidth, signFlag, unknownFlag);
    uint32_t words = getNumWords(bitWidth, false);
    uint64_t* dst = result.getRawData();
    const uint64_t* src = getRawData();

    for (uint32_t i = 0; i < words; i++)
        dst[i] = reverseBits64(src[words - i - 1]);

    if (unknownFlag) {
        dst += words;
        src += words;
        for (uint32_t i = 0; i < words; i++)
            dst[i] = reverseBits64(src[words - i - 1]);
    }

    // If we aren't aligned to a multiple of 64 bits, we need to shift
    // the result back down because we reversed some bits that weren't
    // actually included in the number.
    bitwidth_t msw = bitWidth % BITS_PER_WORD;
    if (msw != 0)
        return result.lshr(BITS_PER_WORD - msw);

    return result;
}